

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

void * block_eval(Env *env,BlockStmt *stmt)

{
  List *list_00;
  undefined8 *puVar1;
  uint local_2c;
  int i;
  List *list;
  void *elem;
  BlockStmt *stmt_local;
  Env *env_local;
  
  list_00 = stmt->stmts;
  for (local_2c = 0; local_2c < list_00->size; local_2c = local_2c + 1) {
    puVar1 = (undefined8 *)list_get(list_00,local_2c);
    if (puVar1 != (undefined8 *)0x0) {
      (*(code *)*puVar1)(env,puVar1);
    }
  }
  return (void *)0x0;
}

Assistant:

void *block_eval(Env *env, BlockStmt *stmt) {
    void* elem;
    List* list = stmt->stmts;
    for (int i = 0; i < list->size; ++i) {
        elem = list_get(list, i);
        if (elem == NULL)continue;
        tree_node(elem)->eval(env, elem);
    }
    return NULL;
}